

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

int __thiscall pstore::file::file_handle::rename(file_handle *this,char *__old,char *__new)

{
  undefined1 uVar1;
  int iVar2;
  czstring old_path;
  czstring new_path;
  ostream *__os;
  undefined8 uVar3;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  errno_erc local_1fc;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1f8;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1e8;
  ostringstream local_1d8 [8];
  ostringstream message;
  undefined1 local_48 [4];
  int err;
  string *local_28;
  string *path;
  string *psStack_18;
  bool result;
  string *new_name_local;
  file_handle *this_local;
  
  path._7_1_ = 1;
  psStack_18 = (string *)__old;
  new_name_local = (string *)this;
  path_abi_cxx11_((string *)local_48,this);
  local_28 = (string *)local_48;
  old_path = (czstring)std::__cxx11::string::c_str();
  new_path = (czstring)std::__cxx11::string::c_str();
  iVar2 = anon_unknown.dwarf_293b86::rename_noreplace(old_path,new_path);
  if (iVar2 < 0) {
    if (-iVar2 != 0x11) {
      std::__cxx11::ostringstream::ostringstream(local_1d8);
      __os = std::operator<<((ostream *)local_1d8,"Unable to rename ");
      _Var4 = quoted(local_28);
      local_1e8._M_string = _Var4._M_string;
      local_1f8._8_2_ = _Var4._8_2_;
      local_1e8._M_delim = local_1f8._M_delim;
      local_1e8._M_escape = local_1f8._M_escape;
      local_1f8 = _Var4;
      std::__detail::operator<<(__os,&local_1e8);
      errno_erc::errno_erc(&local_1fc,-iVar2);
      std::__cxx11::ostringstream::str();
      raise<pstore::errno_erc,std::__cxx11::string>(local_1fc,&local_220);
    }
    path._7_1_ = 0;
  }
  else {
    std::__cxx11::string::operator=((string *)&this->path_,psStack_18);
  }
  uVar1 = path._7_1_;
  uVar3 = std::__cxx11::string::~string((string *)local_48);
  return (uint)CONCAT71((int7)((ulong)uVar3 >> 8),uVar1) & 0xffffff01;
}

Assistant:

bool file_handle::rename (std::string const & new_name) {
            bool result = true;
            auto const & path = this->path ();
            int err = rename_noreplace (path.c_str (), new_name.c_str ());
            if (err >= 0) {
                path_ = new_name;
            } else {
                err = -err;
                if (err == EEXIST) {
                    result = false;
                } else {
                    std::ostringstream message;
                    message << "Unable to rename " << pstore::quoted (path);
                    raise (errno_erc{err}, message.str ());
                }
            }
            return result;
        }